

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

bool leveldb::GetLevel(Slice *input,int *level)

{
  bool bVar1;
  uint local_24;
  uint *puStack_20;
  uint32_t v;
  int *level_local;
  Slice *input_local;
  
  puStack_20 = (uint *)level;
  level_local = (int *)input;
  bVar1 = GetVarint32(input,&local_24);
  if ((bVar1) && (local_24 < 7)) {
    *puStack_20 = local_24;
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool GetLevel(Slice* input, int* level) {
  uint32_t v;
  if (GetVarint32(input, &v) && v < config::kNumLevels) {
    *level = v;
    return true;
  } else {
    return false;
  }
}